

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

size_t printArg4(PDISASM pMyDisasm,size_t i)

{
  size_t local_18;
  size_t i_local;
  PDISASM pMyDisasm_local;
  
  if (((pMyDisasm->Reserved_).MemDecoration < 0x12d) ||
     (0x18e < (pMyDisasm->Reserved_).MemDecoration)) {
    local_18 = printArg(&pMyDisasm->Operand4,pMyDisasm,i);
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = (pMyDisasm->Reserved_).MemDecoration + -300;
    local_18 = printDecoratedArg(&pMyDisasm->Operand4,pMyDisasm,i);
  }
  return local_18;
}

Assistant:

size_t __bea_callspec__ printArg4(PDISASM pMyDisasm, size_t i)
{
  if ((GV.MemDecoration >300) && (GV.MemDecoration < 399)) {
    GV.MemDecoration -= 300;
    i = printDecoratedArg(&pMyDisasm->Operand4, pMyDisasm, i);
  }
  else {
    i = printArg(&pMyDisasm->Operand4, pMyDisasm, i);
  }
  return i;
}